

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::fixup_anonymous_struct_names
          (CompilerGLSL *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited,SPIRType *type)

{
  size_type sVar1;
  SPIRType *type_00;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  uint32_t i;
  ulong uVar3;
  string anon_name;
  string local_50;
  
  local_50._M_dataplus._M_p._0_4_ = (type->super_IVariant).self.id;
  sVar1 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&visited->_M_h,(key_type_conflict *)&local_50);
  if (sVar1 == 0) {
    local_50._M_dataplus._M_p._0_4_ = (type->super_IVariant).self.id;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)visited,(value_type *)&local_50);
    for (uVar3 = 0;
        uVar3 < (uint)(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        uVar3 = uVar3 + 1) {
      type_00 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,
                           (type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar3]
                           .id);
      if (type_00->basetype == Struct) {
        psVar2 = Compiler::get_name_abi_cxx11_
                           (&this->super_Compiler,(ID)(type_00->super_IVariant).self.id);
        if (psVar2->_M_string_length == 0) {
          psVar2 = Compiler::get_member_name_abi_cxx11_
                             (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                              (uint32_t)uVar3);
          if (psVar2->_M_string_length != 0) {
            psVar2 = Compiler::get_member_name_abi_cxx11_
                               (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                                (uint32_t)uVar3);
            join<char_const(&)[6],std::__cxx11::string_const&>
                      (&local_50,(spirv_cross *)"anon_",(char (*) [6])psVar2,in_RCX);
            ParsedIR::sanitize_underscores(&local_50);
            Compiler::set_name(&this->super_Compiler,(ID)(type_00->super_IVariant).self.id,&local_50
                              );
            ::std::__cxx11::string::~string((string *)&local_50);
          }
        }
        fixup_anonymous_struct_names(this,visited,type_00);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_anonymous_struct_names(std::unordered_set<uint32_t> &visited, const SPIRType &type)
{
	if (visited.count(type.self))
		return;
	visited.insert(type.self);

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		if (mbr_type.basetype == SPIRType::Struct)
		{
			// If there are multiple aliases, the output might be somewhat unpredictable,
			// but the only real alternative in that case is to do nothing, which isn't any better.
			// This check should be fine in practice.
			if (get_name(mbr_type.self).empty() && !get_member_name(type.self, i).empty())
			{
				auto anon_name = join("anon_", get_member_name(type.self, i));
				ParsedIR::sanitize_underscores(anon_name);
				set_name(mbr_type.self, anon_name);
			}

			fixup_anonymous_struct_names(visited, mbr_type);
		}
	}
}